

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_> * __thiscall
tinyusdz::MetaVariable::
get_value<std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>
          (optional<std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>
           *__return_storage_ptr__,MetaVariable *this)

{
  vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *value;
  
  value = tinyusdz::value::Value::
          as<std::vector<tinyusdz::Reference,std::allocator<tinyusdz::Reference>>>
                    (&this->_value,false);
  if (value == (vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_> *)0x0) {
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
  }
  else {
    nonstd::optional_lite::
    optional<std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_>::
    optional<const_std::vector<tinyusdz::Reference,_std::allocator<tinyusdz::Reference>_>_&,_0>
              (__return_storage_ptr__,value);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    if (const T *v = _value.as<T>()) {
      return *v;
    }

    return nonstd::nullopt;
  }